

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O1

char * deqp::egl::Image::CreateImageGLES2::getStorageName(GLenum storage)

{
  if ((int)storage < 0x8051) {
    switch(storage) {
    case 0x1903:
      return "red";
    case 0x1907:
      return "rgb";
    case 0x1908:
      return "rgba";
    case 0x1909:
      return "luminance";
    case 0x190a:
      return "luminance_alpha";
    }
  }
  else if ((int)storage < 0x81a5) {
    switch(storage) {
    case 0x8051:
      return "rgb8";
    case 0x8056:
      return "rgba4";
    case 0x8057:
      return "rgb5_a1";
    case 0x8058:
      return "rgba8";
    }
  }
  else if ((int)storage < 0x8d48) {
    if (storage == 0x81a5) {
      return "depth_component_16";
    }
    if (storage == 0x8227) {
      return "rg";
    }
  }
  else {
    if (storage == 0x8d48) {
      return "stencil_index8";
    }
    if (storage == 0x8d62) {
      return "rgb565";
    }
  }
  return glcts::fixed_sample_locations_values + 1;
}

Assistant:

static const char* getStorageName (GLenum storage)
	{
		switch (storage)
		{
			case GL_RED:				return "red";
			case GL_RG:					return "rg";
			case GL_LUMINANCE:			return "luminance";
			case GL_LUMINANCE_ALPHA:	return "luminance_alpha";
			case GL_RGB:				return "rgb";
			case GL_RGBA:				return "rgba";
			case GL_DEPTH_COMPONENT16:	return "depth_component_16";
			case GL_RGBA4:				return "rgba4";
			case GL_RGB5_A1:			return "rgb5_a1";
			case GL_RGB565:				return "rgb565";
			case GL_RGB8:				return "rgb8";
			case GL_RGBA8:				return "rgba8";
			case GL_STENCIL_INDEX8:		return "stencil_index8";
			default:
				DE_ASSERT(DE_FALSE);
				return "";
		}
	}